

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilTests.cpp
# Opt level: O2

void deqp::gles3::Functional::DepthStencilCaseUtil::translateCommand
               (RenderCommand *src,RefRenderCommand *dst,TestRenderTarget *renderTarget)

{
  undefined8 *puVar1;
  float fVar2;
  FaceType FVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  TestFunc TVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  float __tmp;
  
  FVar3 = (src->params).visibleFace;
  iVar4 = (src->rect).left;
  iVar6 = iVar4 + -1 + (src->rect).width;
  if (FVar3 == FACETYPE_FRONT) {
    iVar6 = iVar4;
  }
  iVar4 = renderTarget->depthBits;
  iVar5 = renderTarget->stencilBits;
  *(ulong *)(dst->quad).posA.m_data = CONCAT44((src->rect).bottom,iVar6);
  iVar6 = (src->rect).left;
  iVar7 = iVar6 + -1 + (src->rect).width;
  if (FVar3 != FACETYPE_FRONT) {
    iVar7 = iVar6;
  }
  *(ulong *)(dst->quad).posB.m_data = CONCAT44((src->rect).height + (src->rect).bottom + -1,iVar7);
  for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 0x10) {
    puVar1 = (undefined8 *)((long)(dst->quad).color[0].m_data + lVar12);
    uVar8 = *(undefined8 *)((src->color).m_data + 2);
    *puVar1 = *(undefined8 *)(src->color).m_data;
    puVar1[1] = uVar8;
  }
  fVar2 = (src->params).depth;
  for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 4) {
    *(float *)((long)(dst->quad).depth + lVar12) = fVar2 * 0.5 + 0.5;
  }
  uVar11 = 0;
  *(undefined4 *)(dst->state).colorMask.m_data = *(undefined4 *)(src->colorMask).m_data;
  (dst->state).scissorTestEnabled = false;
  uVar10 = 0;
  if (0 < iVar5) {
    uVar10 = *(uint *)&(src->params).stencilTestEnabled;
  }
  (dst->state).stencilTestEnabled = SUB41(uVar10,0);
  if (0 < iVar4) {
    uVar11 = *(uint *)&(src->params).depthTestEnabled;
  }
  (dst->state).depthTestEnabled = SUB41(uVar11,0);
  (dst->state).blendMode = BLENDMODE_NONE;
  (dst->state).numStencilBits = renderTarget->stencilBits;
  if ((uVar11 & 1) != 0) {
    TVar9 = sglr::rr_util::mapGLTestFunc((src->params).depthFunc);
    (dst->state).depthFunc = TVar9;
    (dst->state).depthMask = (src->params).depthWriteMask;
    uVar10 = (uint)(dst->state).stencilTestEnabled;
  }
  if ((uVar10 & 1) != 0) {
    translateStencilState((src->params).stencil + 1,(dst->state).stencilStates + 1);
    translateStencilState((src->params).stencil,(dst->state).stencilStates);
    return;
  }
  return;
}

Assistant:

void translateCommand (const RenderCommand& src, RefRenderCommand& dst, const TestRenderTarget& renderTarget)
{
	const float		far				= 1.0f;
	const float		near			= 0.0f;
	bool			hasDepth		= renderTarget.depthBits > 0;
	bool			hasStencil		= renderTarget.stencilBits > 0;
	bool			isFrontFacing	= src.params.visibleFace == rr::FACETYPE_FRONT;

	dst.quad.posA = IVec2(isFrontFacing ? src.rect.left : (src.rect.left+src.rect.width-1), src.rect.bottom);
	dst.quad.posB = IVec2(isFrontFacing ? (src.rect.left+src.rect.width-1) : src.rect.left, src.rect.bottom+src.rect.height-1);

	std::fill(DE_ARRAY_BEGIN(dst.quad.color), DE_ARRAY_END(dst.quad.color), src.color);
	std::fill(DE_ARRAY_BEGIN(dst.quad.depth), DE_ARRAY_END(dst.quad.depth), ((far-near)/2.0f) * src.params.depth + (near+far)/2.0f);

	dst.state.colorMask = src.colorMask;

	dst.state.scissorTestEnabled		= false;
	dst.state.stencilTestEnabled		= hasStencil && src.params.stencilTestEnabled;
	dst.state.depthTestEnabled			= hasDepth && src.params.depthTestEnabled;
	dst.state.blendMode					= rr::BLENDMODE_NONE;
	dst.state.numStencilBits			= renderTarget.stencilBits;

	if (dst.state.depthTestEnabled)
	{
		dst.state.depthFunc					= sglr::rr_util::mapGLTestFunc(src.params.depthFunc);
		dst.state.depthMask					= src.params.depthWriteMask;
	}

	if (dst.state.stencilTestEnabled)
	{
		translateStencilState(src.params.stencil[rr::FACETYPE_BACK],	dst.state.stencilStates[rr::FACETYPE_BACK]);
		translateStencilState(src.params.stencil[rr::FACETYPE_FRONT],	dst.state.stencilStates[rr::FACETYPE_FRONT]);
	}
}